

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O3

void ecx_SDOerror(ecx_contextt *context,uint16 Slave,uint16 Index,uint8 SubIdx,int32 AbortCode)

{
  ec_errort Ec;
  ec_errort local_48;
  
  local_48.Time = osal_current_time();
  *context->ecaterror = '\x01';
  local_48.Etype = EC_ERR_TYPE_SDO_ERROR;
  local_48.Slave = Slave;
  local_48.Index = Index;
  local_48.SubIdx = SubIdx;
  local_48.field_6.AbortCode = AbortCode;
  ecx_pusherror(context,&local_48);
  return;
}

Assistant:

PACKED_END

/** Report SDO error.
 *
 * @param[in]  context        = context struct
 * @param[in]  Slave      = Slave number
 * @param[in]  Index      = Index that generated error
 * @param[in]  SubIdx     = Subindex that generated error
 * @param[in]  AbortCode  = Abortcode, see EtherCAT documentation for list
 */
void ecx_SDOerror(ecx_contextt *context, uint16 Slave, uint16 Index, uint8 SubIdx, int32 AbortCode)
{
   ec_errort Ec;

   Ec.Time = osal_current_time();
   Ec.Slave = Slave;
   Ec.Index = Index;
   Ec.SubIdx = SubIdx;
   *(context->ecaterror) = TRUE;
   Ec.Etype = EC_ERR_TYPE_SDO_ERROR;
   Ec.AbortCode = AbortCode;
   ecx_pusherror(context, &Ec);
}